

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O3

NETSOCKET net_udp_create(NETADDR bindaddr,int use_random_port)

{
  NETADDR NVar1;
  uint __fd;
  int __fd_00;
  ulong uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  NETSOCKET NVar4;
  NETSOCKET sock;
  NETADDR tmpbindaddr;
  undefined4 local_6c;
  undefined4 local_68;
  sockaddr_in6 local_64;
  NETADDR local_48;
  long local_30;
  
  NVar1 = bindaddr;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0xffffffff00000000;
  local_48.ip[0xc] = bindaddr.ip[0xc];
  local_48.ip[0xd] = bindaddr.ip[0xd];
  local_48.ip[0xe] = bindaddr.ip[0xe];
  local_48.ip[0xf] = bindaddr.ip[0xf];
  local_48.port = bindaddr.port;
  local_48.reserved = bindaddr.reserved;
  local_48._0_8_ = NVar1._0_8_;
  local_48.ip[4] = bindaddr.ip[4];
  local_48.ip[5] = bindaddr.ip[5];
  local_48.ip[6] = bindaddr.ip[6];
  local_48.ip[7] = bindaddr.ip[7];
  local_48.ip[8] = bindaddr.ip[8];
  local_48.ip[9] = bindaddr.ip[9];
  local_48.ip[10] = bindaddr.ip[10];
  local_48.ip[0xb] = bindaddr.ip[0xb];
  local_68 = 1;
  local_6c = 0x10000;
  uVar3 = 0;
  if (((undefined1  [24])NVar1 & (undefined1  [24])0x1) != (undefined1  [24])0x0) {
    local_48.ip._0_4_ = NVar1.ip._0_4_;
    local_48.type = 1;
    netaddr_to_sockaddr_in(&local_48,(sockaddr_in *)&local_64);
    __fd = priv_net_create_socket(2,2,(sockaddr *)&local_64,0x10,use_random_port);
    if ((int)__fd < 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = 1;
      setsockopt(__fd,1,6,&local_68,4);
      setsockopt(__fd,1,8,&local_6c,4);
      uVar2 = (ulong)__fd << 0x20;
    }
  }
  __fd_00 = -1;
  if (((undefined1  [24])NVar1 & (undefined1  [24])0x2) != (undefined1  [24])0x0) {
    local_48.type = 2;
    netaddr_to_sockaddr_in6(&local_48,&local_64);
    __fd_00 = priv_net_create_socket(10,2,(sockaddr *)&local_64,0x1c,use_random_port);
    if (-1 < __fd_00) {
      uVar3 = uVar3 | 2;
      setsockopt(__fd_00,1,6,&local_68,4);
      setsockopt(__fd_00,1,8,&local_6c,4);
    }
  }
  uVar2 = uVar2 | uVar3;
  sock.ipv6sock = __fd_00;
  sock.type = (int)uVar2;
  sock.ipv4sock = (int)(uVar2 >> 0x20);
  net_set_non_blocking(sock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    NVar4.ipv6sock = __fd_00;
    NVar4.type = (int)uVar2;
    NVar4.ipv4sock = (int)(uVar2 >> 0x20);
    return NVar4;
  }
  __stack_chk_fail();
}

Assistant:

NETSOCKET net_udp_create(NETADDR bindaddr, int use_random_port)
{
	NETSOCKET sock = invalid_socket;
	NETADDR tmpbindaddr = bindaddr;
	int broadcast = 1;
	int recvsize = 65536;

	if(bindaddr.type&NETTYPE_IPV4)
	{
		struct sockaddr_in addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV4;
		netaddr_to_sockaddr_in(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET, SOCK_DGRAM, (struct sockaddr *)&addr, sizeof(addr), use_random_port);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV4;
			sock.ipv4sock = socket;

			/* set broadcast */
			setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (const char*)&broadcast, sizeof(broadcast));

			/* set receive buffer size */
			setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&recvsize, sizeof(recvsize));
		}
	}

	if(bindaddr.type&NETTYPE_IPV6)
	{
		struct sockaddr_in6 addr;
		int socket = -1;

		/* bind, we should check for error */
		tmpbindaddr.type = NETTYPE_IPV6;
		netaddr_to_sockaddr_in6(&tmpbindaddr, &addr);
		socket = priv_net_create_socket(AF_INET6, SOCK_DGRAM, (struct sockaddr *)&addr, sizeof(addr), use_random_port);
		if(socket >= 0)
		{
			sock.type |= NETTYPE_IPV6;
			sock.ipv6sock = socket;

			/* set broadcast */
			setsockopt(socket, SOL_SOCKET, SO_BROADCAST, (const char*)&broadcast, sizeof(broadcast));

			/* set receive buffer size */
			setsockopt(socket, SOL_SOCKET, SO_RCVBUF, (char*)&recvsize, sizeof(recvsize));
		}
	}

	/* set non-blocking */
	net_set_non_blocking(sock);

	/* return */
	return sock;
}